

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl_mus_player.cpp
# Opt level: O0

void __thiscall OPLmusicFile::Restart(OPLmusicFile *this)

{
  BYTE *pBVar1;
  int local_14;
  int i;
  OPLmusicFile *this_local;
  
  OPLmusicBlock::Restart(&this->super_OPLmusicBlock);
  this->WhichChip = 0;
  switch(this->RawPlayer) {
  case RDosPlay:
    (this->super_OPLmusicBlock).super_musicBlock.score =
         (this->super_OPLmusicBlock).super_musicBlock.scoredata + 10;
    (this->super_OPLmusicBlock).SamplesPerTick =
         (double)*(ushort *)((this->super_OPLmusicBlock).super_musicBlock.scoredata + 8) / 24.0;
    break;
  case IMF:
    (this->super_OPLmusicBlock).super_musicBlock.score =
         (this->super_OPLmusicBlock).super_musicBlock.scoredata + 6;
    for (local_14 = 2; local_14 != 0; local_14 = local_14 + -1) {
      do {
        pBVar1 = (this->super_OPLmusicBlock).super_musicBlock.score;
        (this->super_OPLmusicBlock).super_musicBlock.score = pBVar1 + 1;
      } while (*pBVar1 != '\0');
    }
    (this->super_OPLmusicBlock).super_musicBlock.score =
         (this->super_OPLmusicBlock).super_musicBlock.score + 1;
    if (*(int *)(this->super_OPLmusicBlock).super_musicBlock.score != 0) {
      (this->super_OPLmusicBlock).super_musicBlock.score =
           (this->super_OPLmusicBlock).super_musicBlock.score + 4;
    }
    break;
  case DosBox1:
    (this->super_OPLmusicBlock).super_musicBlock.score =
         (this->super_OPLmusicBlock).super_musicBlock.scoredata + 0x18;
    (this->super_OPLmusicBlock).SamplesPerTick = 49.716;
    break;
  case DosBox2:
    (this->super_OPLmusicBlock).super_musicBlock.score =
         (this->super_OPLmusicBlock).super_musicBlock.scoredata +
         (long)(int)(uint)(this->super_OPLmusicBlock).super_musicBlock.scoredata[0x19] + 0x1a;
    (this->super_OPLmusicBlock).SamplesPerTick = 49.716;
  }
  (*((this->super_OPLmusicBlock).super_musicBlock.io)->_vptr_OPLio[5])
            ((this->super_OPLmusicBlock).SamplesPerTick);
  return;
}

Assistant:

void OPLmusicFile::Restart ()
{
	OPLmusicBlock::Restart();
	WhichChip = 0;
	switch (RawPlayer)
	{
	case RDosPlay:
		score = scoredata + 10;
		SamplesPerTick = LittleShort(*(WORD *)(scoredata + 8)) / ADLIB_CLOCK_MUL;
		break;

	case DosBox1:
		score = scoredata + 24;
		SamplesPerTick = OPL_SAMPLE_RATE / 1000;
		break;

	case DosBox2:
		score = scoredata + 0x1A + scoredata[0x19];
		SamplesPerTick = OPL_SAMPLE_RATE / 1000;
		break;

	case IMF:
		score = scoredata + 6;

		// Skip track and game name
		for (int i = 2; i != 0; --i)
		{
			while (*score++ != '\0') {}
		}
		score++;	// Skip unknown byte
		if (*(DWORD *)score != 0)
		{
			score += 4;		// Skip song length
		}
		break;
	}
	io->SetClockRate(SamplesPerTick);
}